

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O0

void Assimp::FindSceneCenter(aiScene *scene,aiVector3D *out,aiVector3D *min,aiVector3D *max)

{
  float fVar1;
  float *pfVar2;
  aiVector3t<float> aVar3;
  undefined8 local_a8;
  float local_a0;
  aiVector3t<float> local_98;
  aiVector3t<float> local_88;
  aiVector3t<float> local_78;
  aiVector3t<float> local_68 [2];
  undefined1 local_50 [8];
  aiVector3D tmax;
  aiVector3D tmin;
  aiVector3D tout;
  uint i;
  aiVector3D *max_local;
  aiVector3D *min_local;
  aiVector3D *out_local;
  aiScene *scene_local;
  
  if ((scene != (aiScene *)0x0) && (scene->mNumMeshes != 0)) {
    FindMeshCenter(*scene->mMeshes,out,min,max);
    for (tout.y = 1.4013e-45; (uint)tout.y < scene->mNumMeshes; tout.y = (float)((int)tout.y + 1)) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&tmin.y);
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&tmax.y);
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_50);
      FindMeshCenter(scene->mMeshes[(uint)tout.y],(aiVector3D *)&tmin.y,(aiVector3D *)&tmax.y,
                     (aiVector3D *)local_50);
      pfVar2 = aiVector3t<float>::operator[](min,0);
      fVar1 = *pfVar2;
      pfVar2 = aiVector3t<float>::operator[]((aiVector3t<float> *)&tmax.y,0);
      if (*pfVar2 <= fVar1 && fVar1 != *pfVar2) {
        pfVar2 = aiVector3t<float>::operator[]((aiVector3t<float> *)&tmax.y,0);
        fVar1 = *pfVar2;
        pfVar2 = aiVector3t<float>::operator[](min,0);
        *pfVar2 = fVar1;
      }
      pfVar2 = aiVector3t<float>::operator[](min,1);
      fVar1 = *pfVar2;
      pfVar2 = aiVector3t<float>::operator[]((aiVector3t<float> *)&tmax.y,1);
      if (*pfVar2 <= fVar1 && fVar1 != *pfVar2) {
        pfVar2 = aiVector3t<float>::operator[]((aiVector3t<float> *)&tmax.y,1);
        fVar1 = *pfVar2;
        pfVar2 = aiVector3t<float>::operator[](min,1);
        *pfVar2 = fVar1;
      }
      pfVar2 = aiVector3t<float>::operator[](min,2);
      fVar1 = *pfVar2;
      pfVar2 = aiVector3t<float>::operator[]((aiVector3t<float> *)&tmax.y,2);
      if (*pfVar2 <= fVar1 && fVar1 != *pfVar2) {
        pfVar2 = aiVector3t<float>::operator[]((aiVector3t<float> *)&tmax.y,2);
        fVar1 = *pfVar2;
        pfVar2 = aiVector3t<float>::operator[](min,2);
        *pfVar2 = fVar1;
      }
      pfVar2 = aiVector3t<float>::operator[](max,0);
      fVar1 = *pfVar2;
      pfVar2 = aiVector3t<float>::operator[]((aiVector3t<float> *)local_50,0);
      if (fVar1 < *pfVar2) {
        pfVar2 = aiVector3t<float>::operator[]((aiVector3t<float> *)local_50,0);
        fVar1 = *pfVar2;
        pfVar2 = aiVector3t<float>::operator[](max,0);
        *pfVar2 = fVar1;
      }
      pfVar2 = aiVector3t<float>::operator[](max,1);
      fVar1 = *pfVar2;
      pfVar2 = aiVector3t<float>::operator[]((aiVector3t<float> *)local_50,1);
      if (fVar1 < *pfVar2) {
        pfVar2 = aiVector3t<float>::operator[]((aiVector3t<float> *)local_50,1);
        fVar1 = *pfVar2;
        pfVar2 = aiVector3t<float>::operator[](max,1);
        *pfVar2 = fVar1;
      }
      pfVar2 = aiVector3t<float>::operator[](max,2);
      fVar1 = *pfVar2;
      pfVar2 = aiVector3t<float>::operator[]((aiVector3t<float> *)local_50,2);
      if (fVar1 < *pfVar2) {
        pfVar2 = aiVector3t<float>::operator[]((aiVector3t<float> *)local_50,2);
        fVar1 = *pfVar2;
        pfVar2 = aiVector3t<float>::operator[](max,2);
        *pfVar2 = fVar1;
      }
    }
    aVar3 = ::operator-(max,min);
    local_88.z = aVar3.z;
    local_78.z = local_88.z;
    local_88._0_8_ = aVar3._0_8_;
    local_78.x = local_88.x;
    local_78.y = local_88.y;
    aVar3 = ::operator*(&local_78,0.5);
    local_98.z = aVar3.z;
    local_68[0].z = local_98.z;
    local_98._0_8_ = aVar3._0_8_;
    local_68[0].x = local_98.x;
    local_68[0].y = local_98.y;
    aVar3 = ::operator+(min,local_68);
    local_a8 = aVar3._0_8_;
    local_a0 = aVar3.z;
    out->x = (float)(undefined4)local_a8;
    out->y = (float)local_a8._4_4_;
    out->z = local_a0;
  }
  return;
}

Assistant:

void FindSceneCenter (aiScene* scene, aiVector3D& out, aiVector3D& min, aiVector3D& max) {
    if ( NULL == scene ) {
        return;
    }

    if ( 0 == scene->mNumMeshes ) {
        return;
    }
    FindMeshCenter(scene->mMeshes[0], out, min, max);
    for (unsigned int i = 1; i < scene->mNumMeshes; ++i) {
        aiVector3D tout, tmin, tmax;
        FindMeshCenter(scene->mMeshes[i], tout, tmin, tmax);
        if (min[0] > tmin[0]) min[0] = tmin[0];
        if (min[1] > tmin[1]) min[1] = tmin[1];
        if (min[2] > tmin[2]) min[2] = tmin[2];
        if (max[0] < tmax[0]) max[0] = tmax[0];
        if (max[1] < tmax[1]) max[1] = tmax[1];
        if (max[2] < tmax[2]) max[2] = tmax[2];
    }
    out = min + (max-min)*(ai_real)0.5;
}